

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

Status __thiscall soplex::SoPlexBase<double>::optimize(SoPlexBase<double> *this,bool *interrupt)

{
  int iVar1;
  Verbosity VVar2;
  Status SVar3;
  element_type *peVar4;
  SoPlexBase<double> *in_RDI;
  Real RVar5;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity_1;
  Verbosity old_verbosity;
  bool *in_stack_00000298;
  SoPlexBase<double> *in_stack_000002a0;
  SoPlexBase<double> *in_stack_ffffffffffffff28;
  SoPlexBase<double> *in_stack_ffffffffffffff30;
  ostream *in_stack_ffffffffffffff38;
  SoPlexBase<double> *in_stack_ffffffffffffff40;
  Verbosity local_7c [3];
  Verbosity local_70;
  Verbosity local_6c;
  Verbosity local_58;
  Verbosity local_54;
  
  Statistics::clearSolvingData((Statistics *)in_stack_ffffffffffffff30);
  _invalidateSolution(in_stack_ffffffffffffff30);
  iVar1 = intParam(in_RDI,SOLVEMODE);
  if ((iVar1 == 0) ||
     (((iVar1 = intParam(in_RDI,SOLVEMODE), iVar1 == 1 &&
       (RVar5 = realParam(in_RDI,FEASTOL), 1e-09 <= RVar5)) &&
      (RVar5 = realParam(in_RDI,OPTTOL), 1e-09 <= RVar5)))) {
    tolerances(in_stack_ffffffffffffff28);
    peVar4 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1d7843);
    RVar5 = realParam(in_RDI,FEASTOL);
    Tolerances::setFloatingPointFeastol(peVar4,RVar5);
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x1d786d);
    tolerances(in_stack_ffffffffffffff28);
    peVar4 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1d788e);
    RVar5 = realParam(in_RDI,OPTTOL);
    Tolerances::setFloatingPointOpttol(peVar4,RVar5);
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x1d78bb);
    tolerances(in_stack_ffffffffffffff28);
    peVar4 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1d78dc);
    RVar5 = Tolerances::floatingPointFeastol(peVar4);
    in_stack_ffffffffffffff40 = (SoPlexBase<double> *)Settings::realParam._2024_8_;
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x1d790e);
    if (RVar5 < (double)in_stack_ffffffffffffff40) {
      if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
         (VVar2 = SPxOut::getVerbosity(&in_RDI->spxout), 0 < (int)VVar2)) {
        local_54 = SPxOut::getVerbosity(&in_RDI->spxout);
        local_58 = WARNING;
        SPxOut::setVerbosity(&in_RDI->spxout,&stack0xffffffffffffffa8);
        soplex::operator<<((SPxOut *)in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
        soplex::operator<<((SPxOut *)in_stack_ffffffffffffff30,(double)in_stack_ffffffffffffff28);
        soplex::operator<<((SPxOut *)in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
        SPxOut::setVerbosity(&in_RDI->spxout,&stack0xffffffffffffffac);
      }
      peVar4 = std::
               __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1d7a5f);
      Tolerances::setFloatingPointFeastol(peVar4,(Real)Settings::realParam._2024_8_);
    }
    in_stack_ffffffffffffff30 = (SoPlexBase<double> *)&stack0xffffffffffffff98;
    tolerances(in_stack_ffffffffffffff28);
    peVar4 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1d7a94);
    in_stack_ffffffffffffff38 = (ostream *)Tolerances::floatingPointOpttol(peVar4);
    in_stack_ffffffffffffff28 = (SoPlexBase<double> *)Settings::realParam._2032_8_;
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x1d7ac2);
    if ((double)in_stack_ffffffffffffff38 < (double)in_stack_ffffffffffffff28) {
      if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
         (VVar2 = SPxOut::getVerbosity(&in_RDI->spxout), 0 < (int)VVar2)) {
        local_6c = SPxOut::getVerbosity(&in_RDI->spxout);
        local_70 = WARNING;
        SPxOut::setVerbosity(&in_RDI->spxout,&local_70);
        soplex::operator<<((SPxOut *)in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
        soplex::operator<<((SPxOut *)in_stack_ffffffffffffff30,(double)in_stack_ffffffffffffff28);
        soplex::operator<<((SPxOut *)in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
        SPxOut::setVerbosity(&in_RDI->spxout,&local_6c);
      }
      peVar4 = std::
               __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1d7bb7);
      Tolerances::setFloatingPointOpttol(peVar4,(Real)Settings::realParam._2032_8_);
    }
    SPxSolverBase<double>::setSolvingForBoosted(&in_RDI->_solver,false);
    _optimize(in_stack_ffffffffffffff40,(bool *)in_stack_ffffffffffffff38);
  }
  else {
    iVar1 = intParam(in_RDI,SYNCMODE);
    if (iVar1 == 0) {
      _syncLPRational(in_stack_ffffffffffffff30,SUB81((ulong)in_stack_ffffffffffffff28 >> 0x38,0));
      _optimizeRational(in_stack_000002a0,in_stack_00000298);
    }
    else {
      iVar1 = intParam(in_RDI,SYNCMODE);
      if (iVar1 == 2) {
        _optimizeRational(in_stack_000002a0,in_stack_00000298);
      }
      else {
        _optimizeRational(in_stack_000002a0,in_stack_00000298);
      }
    }
  }
  if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
     (VVar2 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar2)) {
    local_7c[2] = SPxOut::getVerbosity(&in_RDI->spxout);
    local_7c[1] = 3;
    SPxOut::setVerbosity(&in_RDI->spxout,local_7c + 1);
    soplex::operator<<((SPxOut *)in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
    local_7c[0] = INFO1;
    SPxOut::getStream(&in_RDI->spxout,local_7c);
    printShortStatistics(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    soplex::operator<<((SPxOut *)in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
    SPxOut::setVerbosity(&in_RDI->spxout,local_7c + 2);
  }
  SVar3 = status(in_RDI);
  return SVar3;
}

Assistant:

typename SPxSolverBase<R>::Status SoPlexBase<R>::optimize(volatile bool* interrupt)
{
   assert(_isConsistent());

   // clear statistics
   _statistics->clearSolvingData();

   // the solution is no longer valid
   _invalidateSolution();

   // decide whether to solve the rational LP with iterative refinement or call the standard floating-point solver
   if(intParam(SoPlexBase<R>::SOLVEMODE) == SOLVEMODE_REAL
         || (intParam(SoPlexBase<R>::SOLVEMODE) == SOLVEMODE_AUTO
             && realParam(SoPlexBase<R>::FEASTOL) >= 1e-9 && realParam(SoPlexBase<R>::OPTTOL) >= 1e-9))
   {
      // the only tolerances used are the ones for the floating-point solver, so set them to the global tolerances
      this->tolerances()->setFloatingPointFeastol(realParam(SoPlexBase<R>::FEASTOL));
      this->tolerances()->setFloatingPointOpttol(realParam(SoPlexBase<R>::OPTTOL));

      // ensure that tolerances are reasonable for the floating-point solver
      // todo: refactor to take into account epsilon value instead
      if(this->tolerances()->floatingPointFeastol() <
            _currentSettings->realParam.lower[SoPlexBase<R>::FPFEASTOL])
      {
         SPX_MSG_WARNING(spxout, spxout <<
                         "Cannot call floating-point solver with feasibility tolerance below "
                         << _currentSettings->realParam.lower[SoPlexBase<R>::FPFEASTOL] << " - relaxing tolerance\n");
         this->_tolerances->setFloatingPointFeastol(
            _currentSettings->realParam.lower[SoPlexBase<R>::FPFEASTOL]);
      }

      if(this->tolerances()->floatingPointOpttol() <
            _currentSettings->realParam.lower[SoPlexBase<R>::FPOPTTOL])
      {
         SPX_MSG_WARNING(spxout, spxout <<
                         "Cannot call floating-point solver with optimality tolerance below "
                         << _currentSettings->realParam.lower[SoPlexBase<R>::FPOPTTOL] << " - relaxing tolerance\n");
         this->_tolerances->setFloatingPointOpttol(
            _currentSettings->realParam.lower[SoPlexBase<R>::FPOPTTOL]);
      }

      _solver.setSolvingForBoosted(false);

      _optimize(interrupt);
#ifdef SOPLEX_DEBUG // this check will remove scaling of the realLP
      _checkBasisScaling();
#endif
   }
   else if(intParam(SoPlexBase<R>::SYNCMODE) == SYNCMODE_ONLYREAL)
   {
      _syncLPRational();
      _optimizeRational(interrupt);
   }
   else if(intParam(SoPlexBase<R>::SYNCMODE) == SYNCMODE_MANUAL)
   {
#ifdef ENABLE_ADDITIONAL_CHECKS
      assert(areLPsInSync(true, true, false));
#else
      assert(areLPsInSync(true, false, false));
#endif

      _optimizeRational(interrupt);

#ifdef ENABLE_ADDITIONAL_CHECKS
      assert(areLPsInSync(true, true, false));
#else
      assert(areLPsInSync(true, false, false));
#endif
   }
   else
   {
#ifdef ENABLE_ADDITIONAL_CHECKS
      assert(areLPsInSync(true, true, false));
#else
      assert(areLPsInSync(true, false, false));
#endif

      _optimizeRational(interrupt);
   }

   SPX_MSG_INFO1(spxout, spxout << "\n";
                 printShortStatistics(spxout.getStream(SPxOut::INFO1));
                 spxout << "\n");


   return status();
}